

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_4000_4999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case4042(DeclarationBinderTester *this)

{
  Expectation *pEVar1;
  socklen_t in_ECX;
  string local_1d8;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"_Complex long double double x ;",&local_31);
  Expectation::Expectation(&local_1b8);
  std::__cxx11::string::string
            ((string *)&local_1d8,
             (string *)&DeclarationBinder::DiagnosticsReporter::ID_of_InvalidType_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1b8,Error,&local_1d8);
  Expectation::Expectation(&local_100,pEVar1);
  bind(this,(int)local_30,(sockaddr *)&local_100,in_ECX);
  Expectation::~Expectation(&local_100);
  std::__cxx11::string::~string((string *)&local_1d8);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case4042()
{
    bind("_Complex long double double x ;",
         Expectation().diagnostic(
             Expectation::ErrorOrWarn::Error,
             DeclarationBinder::DiagnosticsReporter::ID_of_InvalidType));
}